

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmContinueCommand.cxx
# Opt level: O2

bool __thiscall
cmContinueCommand::InitialPass
          (cmContinueCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  allocator local_39;
  string local_38;
  
  bVar2 = cmMakefile::IsLoopBlock((this->super_cmCommand).Makefile);
  if (bVar2) {
    status->ContinueInvoked = true;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&local_38,"The CONTINUE command does not accept any arguments.",&local_39);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_38);
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&local_38,
               "A CONTINUE command was found outside of a proper FOREACH or WHILE loop scope.",
               &local_39);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  cmSystemTools::s_FatalErrorOccured = true;
  return true;
}

Assistant:

bool cmContinueCommand::InitialPass(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  if (!this->Makefile->IsLoopBlock()) {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
                                 "A CONTINUE command was found outside of a "
                                 "proper FOREACH or WHILE loop scope.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }

  status.SetContinueInvoked();

  if (!args.empty()) {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
                                 "The CONTINUE command does not accept any "
                                 "arguments.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }

  return true;
}